

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall pbrt::LightHandle::Preprocess(LightHandle *this,Bounds3f *sceneBounds)

{
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  *in_RDI;
  anon_class_8_1_e43d4cc1 unaff_retaddr;
  anon_class_8_1_e43d4cc1 preprocess;
  
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  ::DispatchCPU<pbrt::LightHandle::Preprocess(pbrt::Bounds3<float>const&)::__0>
            (in_RDI,unaff_retaddr);
  return;
}

Assistant:

void LightHandle::Preprocess(const Bounds3f &sceneBounds) {
    auto preprocess = [&](auto ptr) { return ptr->Preprocess(sceneBounds); };
    return DispatchCPU(preprocess);
}